

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O2

uint8_t * lre_compile(int *plen,char *error_msg,int error_msg_size,char *buf,size_t buf_len,
                     int re_flags,void *opaque)

{
  DynBuf *s;
  int iVar1;
  int iVar2;
  char *fmt;
  int iVar3;
  uint uVar4;
  int iVar5;
  REParseState s_s;
  
  memset(&s_s,0,0x120);
  s_s.opaque = opaque;
  s_s.buf_end = (uint8_t *)(buf + buf_len);
  s_s.is_utf16 = (uint)re_flags >> 4 & 1;
  s_s.ignore_case = (uint)re_flags >> 1 & 1;
  s_s.dotall = (uint)re_flags >> 3 & 1;
  s_s.capture_count = 1;
  s_s.total_capture_count = -1;
  s_s.has_named_captures = -1;
  s_s.buf_ptr = (uint8_t *)buf;
  s_s.buf_start = (uint8_t *)buf;
  s_s.re_flags = re_flags;
  dbuf_init2(&s_s.byte_code,opaque,lre_realloc);
  s = &s_s.group_names;
  dbuf_init2(s,opaque,lre_realloc);
  dbuf_putc(&s_s.byte_code,(uint8_t)re_flags);
  dbuf_putc(&s_s.byte_code,'\0');
  dbuf_putc(&s_s.byte_code,'\0');
  dbuf_put_u32(&s_s.byte_code,0);
  if ((re_flags & 0x20U) == 0) {
    re_emit_op_u32(&s_s,8,6);
    dbuf_putc(&s_s.byte_code,'\x04');
    re_emit_op_u32(&s_s,7,0xfffffff5);
  }
  re_emit_op_u8(&s_s,0xb,0);
  iVar1 = re_parse_disjunction(&s_s,0);
  if (iVar1 == 0) {
    re_emit_op_u8(&s_s,0xc,0);
    dbuf_putc(&s_s.byte_code,'\n');
    if (*s_s.buf_ptr == '\0') {
      if (s_s.byte_code.error != 0) {
        re_parse_out_of_memory(&s_s);
        goto LAB_0015de47;
      }
      iVar2 = 0;
      iVar1 = 0;
      for (iVar3 = 0; iVar3 < (int)s_s.byte_code.size + -7; iVar3 = iVar3 + uVar4) {
        uVar4 = (uint)reopcode_info[s_s.byte_code.buf[(long)iVar3 + 7]].size;
        iVar5 = iVar1;
        switch(s_s.byte_code.buf[(long)iVar3 + 7]) {
        case '\x0f':
        case '\x19':
          iVar5 = iVar1 + 1;
          if ((iVar1 < iVar2) || (iVar2 = iVar5, iVar1 < 0xff)) goto LAB_0015df07;
          goto LAB_0015df82;
        case '\x10':
        case '\x1a':
          iVar5 = iVar1 + -1;
          break;
        case '\x15':
          uVar4 = uVar4 + (uint)*(ushort *)(s_s.byte_code.buf + (long)iVar3 + 8) * 4;
          break;
        case '\x16':
          uVar4 = uVar4 + (uint)*(ushort *)(s_s.byte_code.buf + (long)iVar3 + 8) * 8;
        }
LAB_0015df07:
        iVar1 = iVar5;
      }
      if (-1 < iVar2) {
        s_s.byte_code.buf[1] = (uint8_t)s_s.capture_count;
        s_s.byte_code.buf[2] = (uint8_t)iVar2;
        *(int *)(s_s.byte_code.buf + 3) = (int)s_s.byte_code.size + -7;
        if ((long)s_s.capture_count - 1U < s_s.group_names.size) {
          dbuf_put(&s_s.byte_code,s_s.group_names.buf,s_s.group_names.size);
          *s_s.byte_code.buf = *s_s.byte_code.buf | 0x80;
        }
        dbuf_free(s);
        *error_msg = '\0';
        *plen = (int)s_s.byte_code.size;
        return s_s.byte_code.buf;
      }
LAB_0015df82:
      fmt = "too many imbricated quantifiers";
    }
    else {
      fmt = "extraneous characters at the end";
    }
    re_parse_error(&s_s,fmt);
  }
LAB_0015de47:
  dbuf_free(&s_s.byte_code);
  dbuf_free(s);
  pstrcpy(error_msg,error_msg_size,s_s.u.error_msg);
  *plen = 0;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *lre_compile(int *plen, char *error_msg, int error_msg_size,
                     const char *buf, size_t buf_len, int re_flags,
                     void *opaque)
{
    REParseState s_s, *s = &s_s;
    int stack_size;
    BOOL is_sticky;
    
    memset(s, 0, sizeof(*s));
    s->opaque = opaque;
    s->buf_ptr = (const uint8_t *)buf;
    s->buf_end = s->buf_ptr + buf_len;
    s->buf_start = s->buf_ptr;
    s->re_flags = re_flags;
    s->is_utf16 = ((re_flags & LRE_FLAG_UTF16) != 0);
    is_sticky = ((re_flags & LRE_FLAG_STICKY) != 0);
    s->ignore_case = ((re_flags & LRE_FLAG_IGNORECASE) != 0);
    s->dotall = ((re_flags & LRE_FLAG_DOTALL) != 0);
    s->capture_count = 1;
    s->total_capture_count = -1;
    s->has_named_captures = -1;
    
    dbuf_init2(&s->byte_code, opaque, lre_realloc);
    dbuf_init2(&s->group_names, opaque, lre_realloc);

    dbuf_putc(&s->byte_code, re_flags); /* first element is the flags */
    dbuf_putc(&s->byte_code, 0); /* second element is the number of captures */
    dbuf_putc(&s->byte_code, 0); /* stack size */
    dbuf_put_u32(&s->byte_code, 0); /* bytecode length */
    
    if (!is_sticky) {
        /* iterate thru all positions (about the same as .*?( ... ) )
           .  We do it without an explicit loop so that lock step
           thread execution will be possible in an optimized
           implementation */
        re_emit_op_u32(s, REOP_split_goto_first, 1 + 5);
        re_emit_op(s, REOP_any);
        re_emit_op_u32(s, REOP_goto, -(5 + 1 + 5));
    }
    re_emit_op_u8(s, REOP_save_start, 0);

    if (re_parse_disjunction(s, FALSE)) {
    error:
        dbuf_free(&s->byte_code);
        dbuf_free(&s->group_names);
        pstrcpy(error_msg, error_msg_size, s->u.error_msg);
        *plen = 0;
        return NULL;
    }

    re_emit_op_u8(s, REOP_save_end, 0);
    
    re_emit_op(s, REOP_match);

    if (*s->buf_ptr != '\0') {
        re_parse_error(s, "extraneous characters at the end");
        goto error;
    }

    if (dbuf_error(&s->byte_code)) {
        re_parse_out_of_memory(s);
        goto error;
    }
    
    stack_size = compute_stack_size(s->byte_code.buf, s->byte_code.size);
    if (stack_size < 0) {
        re_parse_error(s, "too many imbricated quantifiers");
        goto error;
    }
    
    s->byte_code.buf[RE_HEADER_CAPTURE_COUNT] = s->capture_count;
    s->byte_code.buf[RE_HEADER_STACK_SIZE] = stack_size;
    put_u32(s->byte_code.buf + 3, s->byte_code.size - RE_HEADER_LEN);

    /* add the named groups if needed */
    if (s->group_names.size > (s->capture_count - 1)) {
        dbuf_put(&s->byte_code, s->group_names.buf, s->group_names.size);
        s->byte_code.buf[RE_HEADER_FLAGS] |= LRE_FLAG_NAMED_GROUPS;
    }
    dbuf_free(&s->group_names);
    
#ifdef DUMP_REOP
    lre_dump_bytecode(s->byte_code.buf, s->byte_code.size);
#endif
    
    error_msg[0] = '\0';
    *plen = s->byte_code.size;
    return s->byte_code.buf;
}